

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O2

void key_iterator_suite::iterate_array(void)

{
  bool bVar1;
  const_reference pbVar2;
  size_type in_RCX;
  long lVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  key_iterator local_1e8;
  variable data;
  key_iterator where;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  
  where.index.storage.storage.__data[0] = '\x01';
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_1_ = 1;
  where.index.storage.storage._16_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&data,(basic_array<std::allocator<char>_> *)&where,init);
  lVar3 = 0x120;
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
    ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                    *)((long)&where.
                              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                              .scope + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x30);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin(&where,&data);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc46,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 0;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc47,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope = (pointer)((ulong)local_1e8.
                            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            .scope._4_4_ << 0x20);
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc48,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope = (pointer)CONCAT71(local_1e8.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .scope._1_7_,1);
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_bool,_void>::equal
                    (pbVar2,(bool *)&local_1e8);
  boost::detail::test_impl
            ("where.value() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc49,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4b,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 1;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4c,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 1;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4d,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 2;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.value() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc4e,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc50,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 2;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc51,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope = (pointer)CONCAT44(local_1e8.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .scope._4_4_,2);
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc52,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope = (pointer)0x4008000000000000;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>::equal
                    (pbVar2,(double *)&local_1e8);
  boost::detail::test_impl
            ("where.value() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc53,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc55,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 3;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc56,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 3;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc57,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
          ::equal(pbVar2,"alpha");
  boost::detail::test_impl
            ("where.value() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc58,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5a,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 4;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5b,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 4;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5c,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[6],_void>
          ::equal(pbVar2,L"bravo");
  boost::detail::test_impl
            ("where.value() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5d,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc5f,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 5;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc60,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 5;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc61,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char16_t[8],_void>
          ::equal(pbVar2,L"charlie");
  boost::detail::test_impl
            ("where.value() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc62,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    (&where,&local_1e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc64,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope._0_4_ = 6;
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("*where == 6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc65,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::key(&where);
  local_1e8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .scope = (pointer)CONCAT44(local_1e8.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .scope._4_4_,6);
  bVar1 = trial::dynamic::detail::
          overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::equal
                    (pbVar2,(int *)&local_1e8);
  boost::detail::test_impl
            ("where.key() == 6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc66,"void key_iterator_suite::iterate_array()",bVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::value(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char32_t[6],_void>
          ::equal(pbVar2,L"delta");
  boost::detail::test_impl
            ("where.value() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc67,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++(&where);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end(&local_1e8,&data);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals(&where.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   ,&local_1e8);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc69,"void key_iterator_suite::iterate_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&where);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void iterate_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 0);
    TRIAL_PROTOCOL_TEST(where.key() == 0);
    TRIAL_PROTOCOL_TEST(where.value() == true);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 1);
    TRIAL_PROTOCOL_TEST(where.key() == 1);
    TRIAL_PROTOCOL_TEST(where.value() == 2);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 2);
    TRIAL_PROTOCOL_TEST(where.key() == 2);
    TRIAL_PROTOCOL_TEST(where.value() == 3.0);
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 3);
    TRIAL_PROTOCOL_TEST(where.key() == 3);
    TRIAL_PROTOCOL_TEST(where.value() == "alpha");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 4);
    TRIAL_PROTOCOL_TEST(where.key() == 4);
    TRIAL_PROTOCOL_TEST(where.value() == L"bravo");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 5);
    TRIAL_PROTOCOL_TEST(where.key() == 5);
    TRIAL_PROTOCOL_TEST(where.value() == u"charlie");
    ++where;
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 6);
    TRIAL_PROTOCOL_TEST(where.key() == 6);
    TRIAL_PROTOCOL_TEST(where.value() == U"delta");
    ++where;
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}